

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macho.cc
# Opt level: O0

void bloaty::macho::
     ForEachLoadCommand<bloaty::macho::ParseSymbols(std::basic_string_view<char,std::char_traits<char>>,std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>*,bloaty::RangeSink*)::__0>
               (string_view maybe_fat_file,RangeSink *overhead_sink,
               anon_class_16_2_b2afbd3e *loadcmd_func)

{
  string_view data;
  string_view macho_file;
  uint32_t uVar1;
  RangeSink *in_RCX;
  size_t in_RDX;
  char *in_RDI;
  anon_class_16_2_b2afbd3e *in_stack_00000008;
  RangeSink *in_stack_00000010;
  string_view in_stack_00000018;
  uint32_t magic;
  undefined1 in_stack_ffffffffffffff98 [12];
  undefined4 in_stack_ffffffffffffffa4;
  undefined4 in_stack_ffffffffffffffd8;
  
  data._M_str._4_4_ = in_stack_ffffffffffffffa4;
  data._0_12_ = in_stack_ffffffffffffff98;
  uVar1 = ReadMagic(data);
  if (uVar1 == 0xbebafeca) {
    ParseFatHeader<bloaty::macho::ParseSymbols(std::basic_string_view<char,std::char_traits<char>>,std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>*,bloaty::RangeSink*)::__0>
              (in_stack_00000018,in_stack_00000010,in_stack_00000008);
  }
  else if (((uVar1 == 0xcefaedfe) || (uVar1 == 0xcffaedfe)) ||
          (uVar1 == 0xfeedface || uVar1 == 0xfeedfacf)) {
    macho_file._M_str = in_RDI;
    macho_file._M_len = in_RDX;
    ParseMachOHeader<bloaty::macho::ParseSymbols(std::basic_string_view<char,std::char_traits<char>>,std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,unsigned_long>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,unsigned_long>>>>*,bloaty::RangeSink*)::__0>
              (macho_file,in_RCX,
               (anon_class_16_2_b2afbd3e *)CONCAT44(uVar1,in_stack_ffffffffffffffd8));
  }
  return;
}

Assistant:

void ForEachLoadCommand(string_view maybe_fat_file, RangeSink* overhead_sink,
                        Func&& loadcmd_func) {
  uint32_t magic = ReadMagic(maybe_fat_file);
  switch (magic) {
    case MH_MAGIC:
    case MH_MAGIC_64:
    case MH_CIGAM:
    case MH_CIGAM_64:
      ParseMachOHeader(maybe_fat_file, overhead_sink,
                       std::forward<Func>(loadcmd_func));
      break;
    case FAT_CIGAM:
      ParseFatHeader(maybe_fat_file, overhead_sink,
                     std::forward<Func>(loadcmd_func));
      break;
  }
}